

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

wstring * __thiscall
(anonymous_namespace)::t_debugger::f_read_string_abi_cxx11_
          (wstring *__return_storage_ptr__,void *this,wint_t *a_c,wchar_t a_terminator)

{
  uint uVar1;
  wint_t wVar2;
  wstring *pwVar3;
  undefined4 extraout_var;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  uVar1 = *this;
  pwVar3 = (wstring *)(ulong)uVar1;
  if (uVar1 != (uint)a_c && uVar1 != 0xffffffff) {
    do {
      std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
      push_back(__return_storage_ptr__,(wchar_t)pwVar3);
      wVar2 = getwchar();
      pwVar3 = (wstring *)CONCAT44(extraout_var,wVar2);
      *(wint_t *)this = wVar2;
      if (wVar2 == 0xffffffff) {
        return pwVar3;
      }
    } while (wVar2 != (uint)a_c);
  }
  return pwVar3;
}

Assistant:

std::wstring f_read_string(wint_t& a_c, wchar_t a_terminator)
	{
		std::wstring s;
		while (a_c != WEOF && a_c != a_terminator) {
			s.push_back(a_c);
			a_c = std::getwchar();
		}
		return s;
	}